

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O3

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,
          ScriptHash *scripthash)

{
  SigningProvider *pSVar1;
  int iVar2;
  long in_FS_OFFSET;
  CScriptID local_7c;
  undefined1 local_68 [28];
  uint uStack_4c;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &local_30;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_2f;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_27;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_23;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_21;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_38 = 0;
  local_30 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._16_8_ = 0;
  stack0xffffffffffffffb0 = 0;
  local_68._0_8_ = (char *)0x0;
  local_68._8_8_ = 0;
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    ToScriptID(&local_7c,scripthash);
    iVar2 = (*pSVar1->_vptr_SigningProvider[2])(pSVar1,&local_7c,local_68);
    if ((char)iVar2 != '\0') {
      ProcessSubScript(this,(CScript *)local_68,__return_storage_ptr__);
    }
  }
  if (0x1c < uStack_4c) {
    free((void *)local_68._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const ScriptHash& scripthash) const
    {
        UniValue obj(UniValue::VOBJ);
        CScript subscript;
        if (provider && provider->GetCScript(ToScriptID(scripthash), subscript)) {
            ProcessSubScript(subscript, obj);
        }
        return obj;
    }